

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
CDT::labels_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,CDT *this,Matrix<double> *input_matrix)

{
  uint uVar1;
  Shape SVar2;
  vector<double,_std::allocator<double>_> local_90;
  string local_78;
  undefined8 local_58;
  undefined1 local_50;
  undefined8 local_34;
  undefined1 local_2c;
  uint local_28;
  undefined1 local_21;
  uint i;
  Matrix<double> *input_matrix_local;
  CDT *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *labels;
  
  local_21 = 0;
  _i = input_matrix;
  input_matrix_local = (Matrix<double> *)this;
  this_local = (CDT *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  local_28 = 0;
  while( true ) {
    uVar1 = local_28;
    SVar2 = Matrix<double>::shape(_i);
    local_58 = SVar2._0_8_;
    local_50 = SVar2.is_diogonal;
    local_34._0_4_ = SVar2.n_row;
    if ((uint)local_34 <= uVar1) break;
    local_34 = local_58;
    local_2c = local_50;
    Matrix<double>::get(&local_90,_i,local_28);
    label_abi_cxx11_(&local_78,this,&local_90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::vector<double,_std::allocator<double>_>::~vector(&local_90);
    local_28 = local_28 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> CDT::labels(const Matrix_d& input_matrix) const{
    std::vector<std::string> labels;
    for(unsigned i=0;i<input_matrix.shape().n_row;++i)
        labels.push_back(label(input_matrix.get(i)));
    return labels;
}